

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  Message *pMVar4;
  AssertHelper *in_RSI;
  string *in_RDI;
  AssertionResult gtest_ar_;
  char *partial_regex;
  char *full_pattern;
  size_t full_regex_len;
  int reg_flags;
  char (*in_stack_ffffffffffffff38) [52];
  AssertionResult *in_stack_ffffffffffffff40;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffffff6c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff70;
  string local_80 [32];
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  AssertionResult *in_stack_ffffffffffffffb8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::operator=(in_RDI,(char *)in_RSI);
  sVar3 = strlen((char *)in_RSI);
  __s = (char *)operator_new__(sVar3 + 10);
  snprintf(__s,sVar3 + 10,"^(%s)$",in_RSI);
  iVar2 = regcomp((regex_t *)(in_RDI + 0x28),__s,1);
  in_RDI[0x20] = (string)(iVar2 == 0);
  if (((byte)in_RDI[0x20] & 1) != 0) {
    in_stack_ffffffffffffff70 = in_RSI;
    if (*(char *)&(((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&in_RSI->data_)->_M_t).
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl == '\0') {
      in_stack_ffffffffffffff70 = (AssertHelper *)0x2317f2;
    }
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffff70;
    iVar2 = regcomp((regex_t *)(in_RDI + 0x68),(char *)in_stack_ffffffffffffff70,1);
    in_RDI[0x20] = (string)(iVar2 == 0);
  }
  this_00 = (AssertionResult *)&stack0xffffffffffffffc0;
  AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff40,(bool *)in_stack_ffffffffffffff38,(type *)0x1db0e9);
  bVar1 = AssertionResult::operator_cast_to_bool(this_00);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
  if (!bVar1) {
    Message::Message((Message *)in_stack_ffffffffffffff70);
    pMVar4 = Message::operator<<((Message *)in_stack_ffffffffffffff40,
                                 (char (*) [21])in_stack_ffffffffffffff38);
    iVar2 = (int)((ulong)pMVar4 >> 0x20);
    pMVar4 = Message::operator<<((Message *)in_stack_ffffffffffffff40,
                                 (char **)in_stack_ffffffffffffff38);
    Message::operator<<((Message *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    std::__cxx11::string::c_str();
    AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,type,&this_00->success_,iVar2,(char *)pMVar4);
    AssertHelper::operator=
              (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8._M_head_impl);
    AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_80);
    Message::~Message((Message *)0x1db1f5);
  }
  AssertionResult::~AssertionResult((AssertionResult *)0x1db25b);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = regex;

  // NetBSD (and Android, which takes its regex implemntation from NetBSD) does
  // not include the GNU regex extensions (such as Perl style character classes
  // like \w) in REG_EXTENDED. REG_EXTENDED is only specified to include the
  // [[:alpha:]] style character classes. Enable REG_GNU wherever it is defined
  // so users can use those extensions.
#if defined(REG_GNU)
  constexpr int reg_flags = REG_EXTENDED | REG_GNU;
#else
  constexpr int reg_flags = REG_EXTENDED;
#endif

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, reg_flags) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, reg_flags) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}